

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::acceptAuthenticated
          (AggregateConnectionReceiver *this)

{
  bool bVar1;
  reference t;
  Promise<kj::AuthenticatedStream> *pPVar2;
  AggregateConnectionReceiver *in_RSI;
  AggregateConnectionReceiver *this_local;
  ReducePromises<kj::AuthenticatedStream> *result;
  
  bVar1 = std::
          deque<kj::Promise<kj::AuthenticatedStream>,_std::allocator<kj::Promise<kj::AuthenticatedStream>_>_>
          ::empty(&in_RSI->backlog);
  if (bVar1) {
    newAdaptedPromise<kj::AuthenticatedStream,kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter,kj::(anonymous_namespace)::AggregateConnectionReceiver&>
              ((kj *)this,in_RSI);
    ensureAllAccepting(in_RSI);
  }
  else {
    t = std::
        deque<kj::Promise<kj::AuthenticatedStream>,_std::allocator<kj::Promise<kj::AuthenticatedStream>_>_>
        ::front(&in_RSI->backlog);
    pPVar2 = mv<kj::Promise<kj::AuthenticatedStream>>(t);
    Promise<kj::AuthenticatedStream>::Promise((Promise<kj::AuthenticatedStream> *)this,pPVar2);
    std::
    deque<kj::Promise<kj::AuthenticatedStream>,_std::allocator<kj::Promise<kj::AuthenticatedStream>_>_>
    ::pop_front(&in_RSI->backlog);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> acceptAuthenticated() override {
    // Whenever our accept() is called, we want it to resolve to the first connection accepted by
    // any of our child receivers. Naively, it may seem like we should call accept() on them all
    // and exclusiveJoin() the results. Unfortunately, this might not work in a certain race
    // condition: if two or more of our children receive connections simultaneously, both child
    // accept() calls may return, but we'll only end up taking one and dropping the other.
    //
    // To avoid this problem, we must instead initiate `accept()` calls on all children, and even
    // after one of them returns a result, we must allow the others to keep running. If we end up
    // accepting any sockets from children when there is no outstanding accept() on the aggregate,
    // we must put that socket into a backlog. We only restart accept() calls on children if the
    // backlog is empty, and hence the maximum length of the backlog is the number of children
    // minus 1.

    if (backlog.empty()) {
      auto result = kj::newAdaptedPromise<AuthenticatedStream, Waiter>(*this);
      ensureAllAccepting();
      return result;
    } else {
      auto result = kj::mv(backlog.front());
      backlog.pop_front();
      return result;
    }
  }